

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall
cppjieba::DictTrie::Shrink
          (DictTrie *this,vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *units)

{
  __normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
  in_RSI;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_ffffffffffffffa8;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_ffffffffffffffb8;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_ffffffffffffffc0;
  allocator_type *in_stack_ffffffffffffffd8;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_ffffffffffffffe0;
  __normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
  in_stack_ffffffffffffffe8;
  
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::begin
            (in_stack_ffffffffffffffa8);
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::end
            (in_stack_ffffffffffffffa8);
  std::allocator<cppjieba::DictUnit>::allocator((allocator<cppjieba::DictUnit> *)0x19ce2a);
  std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>::
  vector<__gnu_cxx::__normal_iterator<cppjieba::DictUnit*,std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>>,void>
            (in_stack_ffffffffffffffe0,in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffd8);
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::swap
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::~vector
            (in_stack_ffffffffffffffc0);
  std::allocator<cppjieba::DictUnit>::~allocator((allocator<cppjieba::DictUnit> *)0x19ce67);
  return;
}

Assistant:

void Shrink(vector<DictUnit>& units) const {
    vector<DictUnit>(units.begin(), units.end()).swap(units);
  }